

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant1.c
# Opt level: O0

int select_ncolors(j_decompress_ptr cinfo,int *Ncolors)

{
  int iVar1;
  long in_RSI;
  long *in_RDI;
  int RGB_order [3];
  long temp;
  boolean changed;
  int j;
  int i;
  int iroot;
  int total_colors;
  int max_colors;
  int nc;
  int local_48;
  int local_44 [3];
  long local_38;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  long local_10;
  long *local_8;
  
  local_14 = (int)in_RDI[0x12];
  local_18 = (int)in_RDI[0xf];
  local_44[1] = rgb_red[*(uint *)(in_RDI + 8)];
  local_44[0] = rgb_green[*(uint *)(in_RDI + 8)];
  local_44[2] = rgb_blue[*(uint *)(in_RDI + 8)];
  local_20 = 1;
  iVar1 = local_20;
  do {
    local_20 = iVar1;
    iVar1 = local_20 + 1;
    local_38 = (long)iVar1;
    for (local_24 = 1; local_24 < (int)in_RDI[0x12]; local_24 = local_24 + 1) {
      local_38 = iVar1 * local_38;
    }
  } while (local_38 <= (int)in_RDI[0xf]);
  local_10 = in_RSI;
  local_8 = in_RDI;
  if (local_20 < 2) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x38;
    *(int *)(*in_RDI + 0x2c) = (int)local_38;
    (**(code **)*in_RDI)(in_RDI);
  }
  local_1c = 1;
  for (local_24 = 0; local_24 < local_14; local_24 = local_24 + 1) {
    *(int *)(local_10 + (long)local_24 * 4) = local_20;
    local_1c = local_20 * local_1c;
  }
  do {
    local_2c = 0;
    for (local_24 = 0; local_24 < local_14; local_24 = local_24 + 1) {
      if ((int)local_8[8] == 2) {
        local_48 = local_44[local_24];
      }
      else {
        local_48 = local_24;
      }
      local_28 = local_48;
      local_38 = (long)(*(int *)(local_10 + (long)local_48 * 4) + 1) *
                 (long)(local_1c / *(int *)(local_10 + (long)local_48 * 4));
      if (local_18 < local_38) break;
      *(int *)(local_10 + (long)local_48 * 4) = *(int *)(local_10 + (long)local_48 * 4) + 1;
      local_1c = (int)local_38;
      local_2c = 1;
    }
    if (local_2c == 0) {
      return local_1c;
    }
  } while( true );
}

Assistant:

LOCAL(int)
select_ncolors(j_decompress_ptr cinfo, int Ncolors[])
/* Determine allocation of desired colors to components, */
/* and fill in Ncolors[] array to indicate choice. */
/* Return value is total number of colors (product of Ncolors[] values). */
{
  int nc = cinfo->out_color_components; /* number of color components */
  int max_colors = cinfo->desired_number_of_colors;
  int total_colors, iroot, i, j;
  boolean changed;
  long temp;
  int RGB_order[3] = { RGB_GREEN, RGB_RED, RGB_BLUE };
  RGB_order[0] = rgb_green[cinfo->out_color_space];
  RGB_order[1] = rgb_red[cinfo->out_color_space];
  RGB_order[2] = rgb_blue[cinfo->out_color_space];

  /* We can allocate at least the nc'th root of max_colors per component. */
  /* Compute floor(nc'th root of max_colors). */
  iroot = 1;
  do {
    iroot++;
    temp = iroot;               /* set temp = iroot ** nc */
    for (i = 1; i < nc; i++)
      temp *= iroot;
  } while (temp <= (long)max_colors); /* repeat till iroot exceeds root */
  iroot--;                      /* now iroot = floor(root) */

  /* Must have at least 2 color values per component */
  if (iroot < 2)
    ERREXIT1(cinfo, JERR_QUANT_FEW_COLORS, (int)temp);

  /* Initialize to iroot color values for each component */
  total_colors = 1;
  for (i = 0; i < nc; i++) {
    Ncolors[i] = iroot;
    total_colors *= iroot;
  }
  /* We may be able to increment the count for one or more components without
   * exceeding max_colors, though we know not all can be incremented.
   * Sometimes, the first component can be incremented more than once!
   * (Example: for 16 colors, we start at 2*2*2, go to 3*2*2, then 4*2*2.)
   * In RGB colorspace, try to increment G first, then R, then B.
   */
  do {
    changed = FALSE;
    for (i = 0; i < nc; i++) {
      j = (cinfo->out_color_space == JCS_RGB ? RGB_order[i] : i);
      /* calculate new total_colors if Ncolors[j] is incremented */
      temp = total_colors / Ncolors[j];
      temp *= Ncolors[j] + 1;   /* done in long arith to avoid oflo */
      if (temp > (long)max_colors)
        break;                  /* won't fit, done with this pass */
      Ncolors[j]++;             /* OK, apply the increment */
      total_colors = (int)temp;
      changed = TRUE;
    }
  } while (changed);

  return total_colors;
}